

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSetValidErrors
               (xmlSchemaValidCtxtPtr ctxt,xmlSchemaValidityErrorFunc err,
               xmlSchemaValidityWarningFunc warn,void *ctx)

{
  xmlSchemaValidCtxtPtr pxVar1;
  xmlSchemaParserCtxtPtr pxVar2;
  
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    pxVar2 = ctxt->pctxt;
    while (pxVar2 != (xmlSchemaParserCtxtPtr)0x0) {
      pxVar2->error = err;
      pxVar2->warning = warn;
      pxVar2->errCtxt = ctx;
      pxVar1 = pxVar2->vctxt;
      if (pxVar1 == (xmlSchemaValidCtxtPtr)0x0) {
        return;
      }
      pxVar1->error = err;
      pxVar1->warning = warn;
      pxVar1->errCtxt = ctx;
      pxVar2 = pxVar1->pctxt;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetValidErrors(xmlSchemaValidCtxtPtr ctxt,
                        xmlSchemaValidityErrorFunc err,
                        xmlSchemaValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != NULL)
	xmlSchemaSetParserErrors(ctxt->pctxt, err, warn, ctx);
}